

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vdrawhelper.cpp
# Opt level: O1

void fetch_radial_gradient(uint32_t *buffer,Operator *op,VSpanData *data,int y,int x,int length)

{
  uint32_t *puVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  Spread SVar4;
  bool bVar5;
  uint uVar6;
  uint32_t uVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  
  fVar16 = (op->field_4).radial.a;
  if (ABS(fVar16) <= 1e-06) {
    memfill32(buffer,0,length);
    return;
  }
  fVar9 = (float)y + 0.5;
  fVar10 = data->m11;
  fVar13 = data->m12;
  fVar11 = (float)x + 0.5;
  fVar8 = data->m13;
  if ((fVar8 != 0.0) || (NAN(fVar8))) {
    bVar5 = false;
  }
  else {
    bVar5 = data->m23 == 0.0;
  }
  fVar17 = fVar10 * fVar11 + data->m21 * fVar9 + data->dx;
  fVar14 = fVar13 * fVar11 + data->m22 * fVar9 + data->dy;
  puVar1 = buffer + length;
  if (bVar5) {
    fVar17 = fVar17 - (data->mGradient).field_1.linear.x2;
    fVar14 = fVar14 - (data->mGradient).field_1.linear.y2;
    fVar11 = 1.0 / (fVar16 + fVar16);
    fVar8 = (op->field_4).linear.dx;
    fVar9 = (op->field_4).linear.dy;
    fVar12 = fVar14 * fVar9 +
             (op->field_4).linear.l * (data->mGradient).field_1.radial.fradius + fVar17 * fVar8;
    fVar12 = fVar12 + fVar12;
    fVar9 = fVar8 * fVar10 + fVar9 * fVar13;
    fVar9 = fVar9 + fVar9;
    fVar18 = fVar11 * fVar12;
    fVar8 = fVar10 * fVar10 + fVar13 * fVar13;
    fVar15 = fVar14 * fVar13 + fVar17 * fVar10;
    fVar10 = fVar11 * fVar11;
    fVar16 = fVar16 * 4.0;
    fVar13 = (fVar12 * fVar12 -
             ((op->field_4).linear.off - (fVar17 * fVar17 + fVar14 * fVar14)) * fVar16) * fVar10;
    fVar14 = ((fVar15 + fVar15 + fVar8) * fVar16 + fVar9 * fVar9 + (fVar12 + fVar12) * fVar9) *
             fVar10;
    fVar10 = (fVar16 * (fVar8 + fVar8) + (fVar9 + fVar9) * fVar9) * fVar10;
    if ((op->field_4).radial.extended == false) {
      if (0 < length) {
        do {
          if (fVar13 < 0.0) {
            fVar16 = sqrtf(fVar13);
          }
          else {
            fVar16 = SQRT(fVar13);
          }
          uVar6 = (uint)((fVar16 - fVar18) * 1023.0 + 0.5);
          SVar4 = (data->mGradient).mSpread;
          if (SVar4 == Reflect) {
            uVar6 = uVar6 & 0x7ff;
            if (0x3ff < uVar6) {
              uVar6 = uVar6 ^ 0x7ff;
            }
          }
          else if (SVar4 == Repeat) {
            uVar6 = uVar6 & 0x3ff;
          }
          else if ((int)uVar6 < 0) {
            uVar6 = 0;
          }
          else if (0x3fe < (int)uVar6) {
            uVar6 = 0x3ff;
          }
          *buffer = (data->mGradient).mColorTable[(int)uVar6];
          buffer = buffer + 1;
          fVar13 = fVar13 + fVar14;
          fVar14 = fVar14 + fVar10;
          fVar18 = fVar18 + fVar11 * fVar9;
        } while (buffer < puVar1);
      }
    }
    else if (0 < length) {
      do {
        uVar7 = 0;
        if (fVar13 >= 0.0) {
          if (fVar13 < 0.0) {
            fVar16 = sqrtf(fVar13);
          }
          else {
            fVar16 = SQRT(fVar13);
          }
          uVar7 = 0;
          if (0.0 <= (op->field_4).linear.l * (fVar16 - fVar18) +
                     (data->mGradient).field_1.radial.fradius) {
            uVar6 = (uint)((fVar16 - fVar18) * 1023.0 + 0.5);
            SVar4 = (data->mGradient).mSpread;
            if (SVar4 == Reflect) {
              uVar6 = uVar6 & 0x7ff;
              if (0x3ff < uVar6) {
                uVar6 = uVar6 ^ 0x7ff;
              }
            }
            else if (SVar4 == Repeat) {
              uVar6 = uVar6 & 0x3ff;
            }
            else if ((int)uVar6 < 0) {
              uVar6 = 0;
            }
            else if (0x3fe < (int)uVar6) {
              uVar6 = 0x3ff;
            }
            uVar7 = (data->mGradient).mColorTable[(int)uVar6];
          }
        }
        *buffer = uVar7;
        fVar13 = fVar13 + fVar14;
        fVar14 = fVar14 + fVar10;
        fVar18 = fVar18 + fVar11 * fVar9;
        buffer = buffer + 1;
      } while (buffer < puVar1);
    }
  }
  else if (0 < length) {
    fVar16 = fVar8 * fVar11 + fVar9 * data->m23 + data->m33;
    do {
      uVar7 = 0;
      if ((fVar16 != 0.0) || (NAN(fVar16))) {
        fVar10 = fVar17 * (1.0 / fVar16) - (data->mGradient).field_1.linear.x2;
        fVar13 = (1.0 / fVar16) * fVar14 - (data->mGradient).field_1.linear.y2;
        fVar8 = (op->field_4).linear.dy * fVar13 +
                (op->field_4).linear.l * (data->mGradient).field_1.radial.fradius +
                (op->field_4).linear.dx * fVar10;
        fVar8 = fVar8 + fVar8;
        fVar10 = fVar8 * fVar8 +
                 (op->field_4).radial.a * -4.0 *
                 ((op->field_4).linear.off - (fVar10 * fVar10 + fVar13 * fVar13));
        if (fVar10 >= 0.0) {
          if (fVar10 < 0.0) {
            fVar10 = sqrtf(fVar10);
          }
          else {
            fVar10 = SQRT(fVar10);
          }
          fVar13 = (op->field_4).radial.inv2a;
          fVar9 = (-fVar8 - fVar10) * fVar13;
          fVar13 = (fVar10 - fVar8) * fVar13;
          if (fVar13 <= fVar9) {
            fVar13 = fVar9;
          }
          uVar7 = 0;
          if (0.0 <= (op->field_4).linear.l * fVar13 + (data->mGradient).field_1.radial.fradius) {
            uVar6 = (uint)(fVar13 * 1023.0 + 0.5);
            SVar4 = (data->mGradient).mSpread;
            if (SVar4 == Reflect) {
              uVar6 = uVar6 & 0x7ff;
              if (0x3ff < uVar6) {
                uVar6 = uVar6 ^ 0x7ff;
              }
            }
            else if (SVar4 == Repeat) {
              uVar6 = uVar6 & 0x3ff;
            }
            else if ((int)uVar6 < 0) {
              uVar6 = 0;
            }
            else if (0x3fe < (int)uVar6) {
              uVar6 = 0x3ff;
            }
            uVar7 = (data->mGradient).mColorTable[(int)uVar6];
          }
        }
      }
      *buffer = uVar7;
      fVar17 = fVar17 + data->m11;
      uVar2 = data->m12;
      uVar3 = data->m13;
      fVar14 = fVar14 + (float)uVar2;
      fVar16 = fVar16 + (float)uVar3;
      buffer = buffer + 1;
    } while (buffer < puVar1);
  }
  return;
}

Assistant:

void fetch_radial_gradient(uint32_t *buffer, const Operator *op,
                           const VSpanData *data, int y, int x, int length)
{
    // avoid division by zero
    if (vIsZero(op->radial.a)) {
        memfill32(buffer, 0, length);
        return;
    }

    float rx =
        data->m21 * (y + float(0.5)) + data->dx + data->m11 * (x + float(0.5));
    float ry =
        data->m22 * (y + float(0.5)) + data->dy + data->m12 * (x + float(0.5));
    bool affine = !data->m13 && !data->m23;

    uint32_t *end = buffer + length;
    if (affine) {
        rx -= data->mGradient.radial.fx;
        ry -= data->mGradient.radial.fy;

        float inv_a = 1 / float(2 * op->radial.a);

        const float delta_rx = data->m11;
        const float delta_ry = data->m12;

        float b = 2 * (op->radial.dr * data->mGradient.radial.fradius +
                       rx * op->radial.dx + ry * op->radial.dy);
        float delta_b =
            2 * (delta_rx * op->radial.dx + delta_ry * op->radial.dy);
        const float b_delta_b = 2 * b * delta_b;
        const float delta_b_delta_b = 2 * delta_b * delta_b;

        const float bb = b * b;
        const float delta_bb = delta_b * delta_b;

        b *= inv_a;
        delta_b *= inv_a;

        const float rxrxryry = rx * rx + ry * ry;
        const float delta_rxrxryry = delta_rx * delta_rx + delta_ry * delta_ry;
        const float rx_plus_ry = 2 * (rx * delta_rx + ry * delta_ry);
        const float delta_rx_plus_ry = 2 * delta_rxrxryry;

        inv_a *= inv_a;

        float det =
            (bb - 4 * op->radial.a * (op->radial.sqrfr - rxrxryry)) * inv_a;
        float delta_det = (b_delta_b + delta_bb +
                           4 * op->radial.a * (rx_plus_ry + delta_rxrxryry)) *
                          inv_a;
        const float delta_delta_det =
            (delta_b_delta_b + 4 * op->radial.a * delta_rx_plus_ry) * inv_a;

        fetch(buffer, end, op, data, det, delta_det, delta_delta_det, b,
              delta_b);
    } else {
        float rw = data->m23 * (y + float(0.5)) + data->m33 +
                   data->m13 * (x + float(0.5));

        while (buffer < end) {
            if (rw == 0) {
                *buffer = 0;
            } else {
                float invRw = 1 / rw;
                float gx = rx * invRw - data->mGradient.radial.fx;
                float gy = ry * invRw - data->mGradient.radial.fy;
                float b = 2 * (op->radial.dr * data->mGradient.radial.fradius +
                               gx * op->radial.dx + gy * op->radial.dy);
                float det = radialDeterminant(
                    op->radial.a, b, op->radial.sqrfr - (gx * gx + gy * gy));

                uint32_t result = 0;
                if (det >= 0) {
                    float detSqrt = std::sqrt(det);

                    float s0 = (-b - detSqrt) * op->radial.inv2a;
                    float s1 = (-b + detSqrt) * op->radial.inv2a;

                    float s = vMax(s0, s1);

                    if (data->mGradient.radial.fradius + op->radial.dr * s >= 0)
                        result = gradientPixel(&data->mGradient, s);
                }

                *buffer = result;
            }

            rx += data->m11;
            ry += data->m12;
            rw += data->m13;

            ++buffer;
        }
    }
}